

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32m68k.c
# Opt level: O0

uint8_t m68k_reloc_vlink2elf(Reloc *r)

{
  bool bVar1;
  Reloc *in_RDI;
  uint8_t local_1;
  
  bVar1 = isstdreloc(in_RDI,'\x01',0x20);
  if (bVar1 == 0) {
    bVar1 = isstdreloc(in_RDI,'\x01',0x10);
    if (bVar1 == 0) {
      bVar1 = isstdreloc(in_RDI,'\x01',8);
      if (bVar1 == 0) {
        bVar1 = isstdreloc(in_RDI,'\x02',0x20);
        if (bVar1 == 0) {
          bVar1 = isstdreloc(in_RDI,'\x02',0x10);
          if (bVar1 == 0) {
            bVar1 = isstdreloc(in_RDI,'\x02',8);
            if (bVar1 == 0) {
              bVar1 = isstdreloc(in_RDI,'\x03',0x20);
              if (bVar1 == 0) {
                bVar1 = isstdreloc(in_RDI,'\x03',0x10);
                if (bVar1 == 0) {
                  bVar1 = isstdreloc(in_RDI,'\x03',8);
                  if (bVar1 == 0) {
                    bVar1 = isstdreloc(in_RDI,'\x05',0x20);
                    if (bVar1 == 0) {
                      bVar1 = isstdreloc(in_RDI,'\x05',0x10);
                      if (bVar1 == 0) {
                        bVar1 = isstdreloc(in_RDI,'\x05',8);
                        if (bVar1 == 0) {
                          bVar1 = isstdreloc(in_RDI,'\a',0x20);
                          if (bVar1 == 0) {
                            bVar1 = isstdreloc(in_RDI,'\a',0x10);
                            if (bVar1 == 0) {
                              bVar1 = isstdreloc(in_RDI,'\a',8);
                              if (bVar1 == 0) {
                                bVar1 = isstdreloc(in_RDI,'\t',0x20);
                                if (bVar1 == 0) {
                                  bVar1 = isstdreloc(in_RDI,'\t',0x10);
                                  if (bVar1 == 0) {
                                    bVar1 = isstdreloc(in_RDI,'\t',8);
                                    if (bVar1 == 0) {
                                      if (in_RDI->rtype == '\x0e') {
                                        local_1 = '\x13';
                                      }
                                      else if (in_RDI->rtype == '\x06') {
                                        local_1 = '\x14';
                                      }
                                      else if (in_RDI->rtype == '\x0f') {
                                        local_1 = '\x15';
                                      }
                                      else if (in_RDI->rtype == '\r') {
                                        local_1 = '\x16';
                                      }
                                      else {
                                        local_1 = '\0';
                                      }
                                    }
                                    else {
                                      local_1 = '\x12';
                                    }
                                  }
                                  else {
                                    local_1 = '\x11';
                                  }
                                }
                                else {
                                  local_1 = '\x10';
                                }
                              }
                              else {
                                local_1 = '\x0f';
                              }
                            }
                            else {
                              local_1 = '\x0e';
                            }
                          }
                          else {
                            local_1 = '\r';
                          }
                        }
                        else {
                          local_1 = '\f';
                        }
                      }
                      else {
                        local_1 = '\v';
                      }
                    }
                    else {
                      local_1 = '\n';
                    }
                  }
                  else {
                    local_1 = '\t';
                  }
                }
                else {
                  local_1 = '\b';
                }
              }
              else {
                local_1 = '\a';
              }
            }
            else {
              local_1 = '\x06';
            }
          }
          else {
            local_1 = '\x05';
          }
        }
        else {
          local_1 = '\x04';
        }
      }
      else {
        local_1 = '\x03';
      }
    }
    else {
      local_1 = '\x02';
    }
  }
  else {
    local_1 = '\x01';
  }
  return local_1;
}

Assistant:

static uint8_t m68k_reloc_vlink2elf(struct Reloc *r)
/* Try to map vlink-internal representation to a valid ELF reloc type */
{
  if (isstdreloc(r,R_ABS,32)) return R_68K_32;
  else if (isstdreloc(r,R_ABS,16)) return R_68K_16;
  else if (isstdreloc(r,R_ABS,8)) return R_68K_8;
  else if (isstdreloc(r,R_PC,32)) return R_68K_PC32;
  else if (isstdreloc(r,R_PC,16)) return R_68K_PC16;
  else if (isstdreloc(r,R_PC,8)) return R_68K_PC8;
  else if (isstdreloc(r,R_GOT,32)) return R_68K_GOT32;
  else if (isstdreloc(r,R_GOT,16)) return R_68K_GOT16;
  else if (isstdreloc(r,R_GOT,8)) return R_68K_GOT8;
  else if (isstdreloc(r,R_GOTOFF,32)) return R_68K_GOT32O;
  else if (isstdreloc(r,R_GOTOFF,16)) return R_68K_GOT16O;
  else if (isstdreloc(r,R_GOTOFF,8)) return R_68K_GOT8O;
  else if (isstdreloc(r,R_PLT,32)) return R_68K_PLT32;
  else if (isstdreloc(r,R_PLT,16)) return R_68K_PLT16;
  else if (isstdreloc(r,R_PLT,8)) return R_68K_PLT8;
  else if (isstdreloc(r,R_PLTOFF,32)) return R_68K_PLT32O;
  else if (isstdreloc(r,R_PLTOFF,16)) return R_68K_PLT16O;
  else if (isstdreloc(r,R_PLTOFF,8)) return R_68K_PLT8O;
  else if (r->rtype == R_COPY) return R_68K_COPY;
  else if (r->rtype == R_GLOBDAT) return R_68K_GLOB_DAT;
  else if (r->rtype == R_JMPSLOT) return R_68K_JMP_SLOT;
  else if (r->rtype == R_LOADREL) return R_68K_RELATIVE;

  return R_NONE;
}